

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Kernel::clear_kernel(Kernel *this)

{
  switch(this->_oneof_case_[0]) {
  case 1:
  case 2:
  case 3:
  case 4:
    if ((this->kernel_).linearkernel_ != (LinearKernel *)0x0) {
      (*(((this->kernel_).linearkernel_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Kernel::clear_kernel() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Kernel)
  switch (kernel_case()) {
    case kLinearKernel: {
      delete kernel_.linearkernel_;
      break;
    }
    case kRbfKernel: {
      delete kernel_.rbfkernel_;
      break;
    }
    case kPolyKernel: {
      delete kernel_.polykernel_;
      break;
    }
    case kSigmoidKernel: {
      delete kernel_.sigmoidkernel_;
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = KERNEL_NOT_SET;
}